

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIListBox::clear(CGUIListBox *this)

{
  long in_RDI;
  array<irr::gui::CGUIListBox::ListItem> *unaff_retaddr;
  CGUIListBox *in_stack_00000030;
  
  core::array<irr::gui::CGUIListBox::ListItem>::clear(unaff_retaddr);
  *(undefined4 *)(in_RDI + 0x168) = 0;
  *(undefined4 *)(in_RDI + 0x158) = 0xffffffff;
  (**(code **)(**(long **)(in_RDI + 0x180) + 0x168))(*(long **)(in_RDI + 0x180),0);
  recalculateItemHeight(in_stack_00000030);
  return;
}

Assistant:

void CGUIListBox::clear()
{
	Items.clear();
	ItemsIconWidth = 0;
	Selected = -1;

	ScrollBar->setPos(0);

	recalculateItemHeight();
}